

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O2

mz_bool mz_zip_reader_init_internal(mz_zip_archive *pZip,mz_uint flags)

{
  code *pcVar1;
  mz_zip_internal_state *pmVar2;
  mz_bool mVar3;
  
  mVar3 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    if ((pZip->m_pState == (mz_zip_internal_state *)0x0) &&
       (pZip->m_zip_mode == MZ_ZIP_MODE_INVALID)) {
      pcVar1 = pZip->m_pAlloc;
      if (pcVar1 == (mz_alloc_func)0x0) {
        pcVar1 = miniz_def_alloc_func;
        pZip->m_pAlloc = miniz_def_alloc_func;
      }
      if (pZip->m_pFree == (mz_free_func)0x0) {
        pZip->m_pFree = miniz_def_free_func;
      }
      if (pZip->m_pRealloc == (mz_realloc_func)0x0) {
        pZip->m_pRealloc = miniz_def_realloc_func;
      }
      pZip->m_last_error = MZ_ZIP_NO_ERROR;
      pZip->m_archive_size = 0;
      pZip->m_central_directory_file_ofs = 0;
      pZip->m_total_files = 0;
      pmVar2 = (mz_zip_internal_state *)(*pcVar1)(pZip->m_pAlloc_opaque,1,0x98);
      pZip->m_pState = pmVar2;
      if (pmVar2 == (mz_zip_internal_state *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        mVar3 = 0;
      }
      else {
        memset(pmVar2,0,0x98);
        pmVar2 = pZip->m_pState;
        (pmVar2->m_central_dir).m_element_size = 1;
        (pmVar2->m_central_dir_offsets).m_element_size = 4;
        (pmVar2->m_sorted_central_dir_offsets).m_element_size = 4;
        pmVar2->m_init_flags = flags;
        pmVar2->m_zip64 = 0;
        pmVar2->m_zip64_has_extended_info_fields = 0;
        pZip->m_zip_mode = MZ_ZIP_MODE_READING;
        mVar3 = 1;
      }
    }
    else {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  return mVar3;
}

Assistant:

static mz_bool mz_zip_reader_init_internal(mz_zip_archive *pZip, mz_uint flags)
{
    (void)flags;
    if ((!pZip) || (pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!pZip->m_pAlloc)
        pZip->m_pAlloc = miniz_def_alloc_func;
    if (!pZip->m_pFree)
        pZip->m_pFree = miniz_def_free_func;
    if (!pZip->m_pRealloc)
        pZip->m_pRealloc = miniz_def_realloc_func;

    pZip->m_archive_size = 0;
    pZip->m_central_directory_file_ofs = 0;
    pZip->m_total_files = 0;
    pZip->m_last_error = MZ_ZIP_NO_ERROR;

    if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));
    MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir, sizeof(mz_uint8));
    MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets, sizeof(mz_uint32));
    MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets, sizeof(mz_uint32));
    pZip->m_pState->m_init_flags = flags;
    pZip->m_pState->m_zip64 = MZ_FALSE;
    pZip->m_pState->m_zip64_has_extended_info_fields = MZ_FALSE;

    pZip->m_zip_mode = MZ_ZIP_MODE_READING;

    return MZ_TRUE;
}